

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Gradient gradient;
  _Vector_base<GradientColor,_std::allocator<GradientColor>_> local_c0;
  _Tuple_impl<0UL,_std::vector<PixelColor,_std::allocator<PixelColor>_>,_std::vector<double,_std::allocator<double>_>_>
  local_a8;
  tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_78;
  
  eval_args_abi_cxx11_(&local_78,argc,argv);
  load_gradient((Gradient *)&local_c0,
                (string *)
                ((long)&local_78.
                        super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                        .
                        super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                        .
                        super__Tuple_impl<2UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                        .
                        super__Tuple_impl<3UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                        .
                        super__Tuple_impl<4UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                + 0x28));
  go();
  save_image((string *)
             ((long)&local_78.
                     super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     .
                     super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     .
                     super__Tuple_impl<2UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     .
                     super__Tuple_impl<3UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     .
                     super__Tuple_impl<4UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             + 8),&local_a8.
                   super__Head_base<0UL,_std::vector<PixelColor,_std::allocator<PixelColor>_>,_false>
                   ._M_head_impl);
  show_summary((vector<double,_std::allocator<double>_> *)&local_a8);
  std::
  _Tuple_impl<0UL,_std::vector<PixelColor,_std::allocator<PixelColor>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~_Tuple_impl(&local_a8);
  std::_Vector_base<GradientColor,_std::allocator<GradientColor>_>::~_Vector_base(&local_c0);
  std::
  _Tuple_impl<4UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  ::~_Tuple_impl((_Tuple_impl<4UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *)&local_78);
  return 0;
}

Assistant:

int main(int argc, char const* argv[])
{
    auto [image, section, max_iterations, repetitions, gradient_filename, filename, num_threads] = eval_args(argc, argv);
    auto gradient = load_gradient(gradient_filename);

    auto [image_data, durations] = go(image, section, max_iterations, gradient, repetitions, num_threads);

    save_image(filename, image_data);
    show_summary(durations);
}